

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenSIMDTernary(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef a,
                   BinaryenExpressionRef b,BinaryenExpressionRef c)

{
  SIMDTernary *pSVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pSVar1 = wasm::Builder::makeSIMDTernary(&local_10,op,a,b,c);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDTernary(BinaryenModuleRef module,
                                          BinaryenOp op,
                                          BinaryenExpressionRef a,
                                          BinaryenExpressionRef b,
                                          BinaryenExpressionRef c) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDTernary(
        SIMDTernaryOp(op), (Expression*)a, (Expression*)b, (Expression*)c));
}